

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Mutex::Fer(Mutex *this,PerThreadSynch *w)

{
  ulong mu;
  long lVar1;
  int c;
  PerThreadSynch *pPVar2;
  SynchWaitParams *waitp;
  bool bVar3;
  
  waitp = w->waitp;
  if (waitp->cond != (Condition *)0x0) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x98c,"Check %s failed: %s","w->waitp->cond == nullptr",
               "Mutex::Fer while waiting on Condition");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x98c,"void absl::Mutex::Fer(PerThreadSynch *)");
  }
  if (waitp->cv_word != (atomic<long> *)0x0) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x98e,"Check %s failed: %s","w->waitp->cv_word == nullptr",
               "Mutex::Fer with pending CondVar queueing");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x98e,"void absl::Mutex::Fer(PerThreadSynch *)");
  }
  (waitp->timeout).rep_ = 0xffffffffffffffff;
  c = 0;
  do {
    mu = (this->mu_).super___atomic_base<long>._M_i;
    if (((waitp->how != (MuHow)kSharedS | 8) & (uint)mu) == 0) {
      w->next = (PerThreadSynch *)0x0;
      (w->state)._M_i = kAvailable;
      AbslInternalPerThreadSemPost_lts_20250127((ThreadIdentity *)w);
      return;
    }
    if ((mu & 0x44) == 0) {
      pPVar2 = Enqueue((PerThreadSynch *)0x0,waitp,mu,6);
      if (pPVar2 == (PerThreadSynch *)0x0) {
        raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x9a6,"Check %s failed: %s","new_h != nullptr","Enqueue failed"
                  );
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x9a6,"void absl::Mutex::Fer(PerThreadSynch *)");
      }
      LOCK();
      bVar3 = mu == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar3) {
        (this->mu_).super___atomic_base<long>._M_i = (ulong)((uint)mu & 0xbb) | (ulong)pPVar2 | 4;
      }
      UNLOCK();
      if (bVar3) {
        return;
      }
    }
    else if ((mu & 0x40) == 0) {
      LOCK();
      bVar3 = mu == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar3) {
        (this->mu_).super___atomic_base<long>._M_i = mu | 0x44;
      }
      UNLOCK();
      if (bVar3) {
        pPVar2 = Enqueue((PerThreadSynch *)(mu & 0xffffffffffffff00),w->waitp,mu,6);
        if (pPVar2 != (PerThreadSynch *)0x0) {
          do {
            lVar1 = (this->mu_).super___atomic_base<long>._M_i;
            LOCK();
            bVar3 = lVar1 == (this->mu_).super___atomic_base<long>._M_i;
            if (bVar3) {
              (this->mu_).super___atomic_base<long>._M_i =
                   (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar2 | 4;
            }
            UNLOCK();
          } while (!bVar3);
          return;
        }
        raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x9b1,"Check %s failed: %s","new_h != nullptr","Enqueue failed"
                  );
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x9b1,"void absl::Mutex::Fer(PerThreadSynch *)");
      }
    }
    c = synchronization_internal::MutexDelay(c,1);
    waitp = w->waitp;
  } while( true );
}

Assistant:

void Mutex::Fer(PerThreadSynch* w) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  ABSL_RAW_CHECK(w->waitp->cond == nullptr,
                 "Mutex::Fer while waiting on Condition");
  ABSL_RAW_CHECK(w->waitp->cv_word == nullptr,
                 "Mutex::Fer with pending CondVar queueing");
  // The CondVar timeout is not relevant for the Mutex wait.
  w->waitp->timeout = {};
  for (;;) {
    intptr_t v = mu_.load(std::memory_order_relaxed);
    // Note: must not queue if the mutex is unlocked (nobody will wake it).
    // For example, we can have only kMuWait (conditional) or maybe
    // kMuWait|kMuWrWait.
    // conflicting != 0 implies that the waking thread cannot currently take
    // the mutex, which in turn implies that someone else has it and can wake
    // us if we queue.
    const intptr_t conflicting =
        kMuWriter | (w->waitp->how == kShared ? 0 : kMuReader);
    if ((v & conflicting) == 0) {
      w->next = nullptr;
      w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
      IncrementSynchSem(this, w);
      return;
    } else {
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h =
            Enqueue(nullptr, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | (v & kMuLow) | kMuWait,
                std::memory_order_release, std::memory_order_relaxed)) {
          return;
        }
      } else if ((v & kMuSpin) == 0 &&
                 mu_.compare_exchange_strong(v, v | kMuSpin | kMuWait)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        do {
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & kMuLow & ~kMuSpin) | kMuWait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
}